

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutengine.cpp
# Opt level: O0

QSize QtMWidgets::qSmartMaxSize(QWidget *w,Alignment align)

{
  QSize QVar1;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_4c;
  QSize local_48;
  QSize local_40;
  QSize local_38;
  QSize local_30;
  QSize local_28;
  QWidget *local_20;
  QWidget *w_local;
  Alignment align_local;
  
  local_20 = w;
  w_local._4_4_ = align.i;
  local_30 = (QSize)(**(code **)(*(long *)w + 0x70))();
  local_38 = (QSize)(**(code **)(*(long *)local_20 + 0x78))();
  local_28 = QSize::expandedTo(&local_30,&local_38);
  local_40 = (QSize)QWidget::minimumSize();
  local_48 = (QSize)QWidget::maximumSize();
  local_4c.data = QWidget::sizePolicy();
  QVar1 = qSmartMaxSize(&local_28,&local_40,&local_48,(QSizePolicy *)&local_4c.bits,w_local._4_4_);
  return QVar1;
}

Assistant:

QSize qSmartMaxSize( const QWidget * w, Qt::Alignment align )
{
	return qSmartMaxSize( w->sizeHint().expandedTo( w->minimumSizeHint() ),
		w->minimumSize(), w->maximumSize(),
		w->sizePolicy(), align );
}